

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
          (CodedInputStream *this,Limit limit)

{
  bool bVar1;
  int iVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  bVar1 = this->legitimate_message_end_;
  PopLimit(this,limit);
  iVar2 = this->recursion_budget_;
  if (this->recursion_limit_ <= iVar2) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x9e);
    other = internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (recursion_budget_) < (recursion_limit_): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
    iVar2 = this->recursion_budget_;
  }
  this->recursion_budget_ = iVar2 + 1;
  return bVar1;
}

Assistant:

bool CodedInputStream::DecrementRecursionDepthAndPopLimit(Limit limit) {
  bool result = ConsumedEntireMessage();
  PopLimit(limit);
  GOOGLE_DCHECK_LT(recursion_budget_, recursion_limit_);
  ++recursion_budget_;
  return result;
}